

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O0

void Cmd_rngseed(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    Printf("Usage: rngseed get|set|clear\n");
  }
  else {
    pcVar2 = FCommandLine::operator[](argv,1);
    iVar1 = strcasecmp(pcVar2,"get");
    if (iVar1 == 0) {
      Printf("rngseed is %d\n",(ulong)rngseed);
    }
    else {
      pcVar2 = FCommandLine::operator[](argv,1);
      iVar1 = strcasecmp(pcVar2,"set");
      if (iVar1 == 0) {
        iVar1 = FCommandLine::argc(argv);
        if (iVar1 == 2) {
          Printf("You need to specify a value to set\n");
        }
        else {
          pcVar2 = FCommandLine::operator[](argv,2);
          staticrngseed = atoi(pcVar2);
          use_staticrng = true;
          Printf("Static rngseed %d will be set for next game\n",(ulong)staticrngseed);
        }
      }
      else {
        pcVar2 = FCommandLine::operator[](argv,1);
        iVar1 = strcasecmp(pcVar2,"clear");
        if (iVar1 == 0) {
          use_staticrng = false;
          Printf("Static rngseed cleared\n");
        }
      }
    }
  }
  return;
}

Assistant:

CCMD(rngseed)
{
	if (argv.argc() == 1)
	{
		Printf("Usage: rngseed get|set|clear\n");
		return;
	}
	if (stricmp(argv[1], "get") == 0)
	{
		Printf("rngseed is %d\n", rngseed);
	}
	else if (stricmp(argv[1], "set") == 0)
	{
		if (argv.argc() == 2)
		{
			Printf("You need to specify a value to set\n");
		}
		else
		{
			staticrngseed = atoi(argv[2]);
			use_staticrng = true;
			Printf("Static rngseed %d will be set for next game\n", staticrngseed);
		}
	}
	else if (stricmp(argv[1], "clear") == 0)
	{
		use_staticrng = false;
		Printf("Static rngseed cleared\n");
	}
}